

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ucol_res.cpp
# Opt level: O0

CollationCacheEntry * __thiscall
icu_63::CollationLoader::createCacheEntry(CollationLoader *this,UErrorCode *errorCode)

{
  UErrorCode *errorCode_local;
  CollationLoader *this_local;
  
  if (this->bundle == (UResourceBundle *)0x0) {
    this_local = (CollationLoader *)loadFromLocale(this,errorCode);
  }
  else if (this->collations == (UResourceBundle *)0x0) {
    this_local = (CollationLoader *)loadFromBundle(this,errorCode);
  }
  else if (this->data == (UResourceBundle *)0x0) {
    this_local = (CollationLoader *)loadFromCollations(this,errorCode);
  }
  else {
    this_local = (CollationLoader *)loadFromData(this,errorCode);
  }
  return (CollationCacheEntry *)this_local;
}

Assistant:

const CollationCacheEntry *
CollationLoader::createCacheEntry(UErrorCode &errorCode) {
    // This is a linear lookup and fallback flow turned into a state machine.
    // Most local variables have been turned into instance fields.
    // In a cache miss, cache.get() calls CacheKey::createObject(),
    // which means that we progress via recursion.
    // loadFromCollations() will recurse to itself as well for collation type fallback.
    if(bundle == NULL) {
        return loadFromLocale(errorCode);
    } else if(collations == NULL) {
        return loadFromBundle(errorCode);
    } else if(data == NULL) {
        return loadFromCollations(errorCode);
    } else {
        return loadFromData(errorCode);
    }
}